

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

IRIns * aa_findcnew(jit_State *J,IRIns *ir)

{
  IROp1 IVar1;
  IRIns *pIVar2;
  
  IVar1 = (ir->field_1).o;
  while( true ) {
    if (IVar1 != ')') {
      pIVar2 = (IRIns *)0x0;
      if (IVar1 == 'S') {
        pIVar2 = ir;
      }
      return pIVar2;
    }
    if (((short)(ir->field_0).op1 < 0) &&
       (pIVar2 = aa_findcnew(J,(J->cur).ir + (ir->field_0).op1), pIVar2 != (IRIns *)0x0)) break;
    if (-1 < (short)(ir->field_0).op2) {
      return (IRIns *)0x0;
    }
    ir = (J->cur).ir + (ir->field_0).op2;
    IVar1 = (ir->field_1).o;
  }
  return pIVar2;
}

Assistant:

static IRIns *aa_findcnew(jit_State *J, IRIns *ir)
{
  while (ir->o == IR_ADD) {
    if (!irref_isk(ir->op1)) {
      IRIns *ir1 = aa_findcnew(J, IR(ir->op1));  /* Left-recursion. */
      if (ir1) return ir1;
    }
    if (irref_isk(ir->op2)) return NULL;
    ir = IR(ir->op2);  /* Flatten right-recursion. */
  }
  return ir->o == IR_CNEW ? ir : NULL;
}